

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::save_state(session_impl *this,entry *eptr,save_state_flags_t flags)

{
  bool bVar1;
  element_type *this_00;
  entry *peVar2;
  const_reference this_01;
  __shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  element_type *peVar3;
  bool local_211;
  shared_ptr<libtorrent::plugin> *ext;
  const_iterator __end2;
  const_iterator __begin2;
  value_type *__range2;
  dht_state local_1b0;
  entry local_168;
  uint local_13c;
  uint local_138;
  uint local_134;
  string_view local_130;
  dht_settings local_120;
  entry local_e0;
  uint local_b8;
  uint local_b4;
  uint local_b0 [4];
  settings_pack local_a0;
  string_view local_50;
  dictionary_type *local_40;
  dictionary_type *sett;
  uint local_30;
  uint local_2c;
  entry *local_28;
  entry *e;
  entry *eptr_local;
  session_impl *this_local;
  save_state_flags_t flags_local;
  
  local_28 = eptr;
  e = eptr;
  eptr_local = (entry *)this;
  this_local._4_4_ = flags.m_val;
  entry::dict_abi_cxx11_(eptr);
  local_30 = this_local._4_4_;
  sett._4_4_ = 1;
  local_2c = (uint)libtorrent::flags::operator&
                             (this_local._4_4_,
                              (bitfield_flag<unsigned_int,_libtorrent::save_state_flags_tag,_void>)1
                             );
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_2c);
  peVar2 = local_28;
  if (bVar1) {
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"settings")
    ;
    peVar2 = entry::operator[](peVar2,local_50);
    local_40 = entry::dict_abi_cxx11_(peVar2);
    non_default_settings(&local_a0,&this->m_settings);
    save_settings_to_dict(&local_a0,local_40);
    settings_pack::~settings_pack(&local_a0);
  }
  local_b4 = this_local._4_4_;
  local_b8 = 2;
  local_b0[0] = (uint)libtorrent::flags::operator&
                                (this_local._4_4_,
                                 (bitfield_flag<unsigned_int,_libtorrent::save_state_flags_tag,_void>
                                  )2);
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)local_b0);
  if (bVar1) {
    get_dht_settings(&local_120,this);
    libtorrent::dht::save_dht_settings(&local_e0,&local_120);
    peVar2 = local_28;
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_130,"dht");
    peVar2 = entry::operator[](peVar2,local_130);
    entry::operator=(peVar2,&local_e0);
    entry::~entry(&local_e0);
  }
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_dht);
  local_211 = false;
  if (bVar1) {
    local_138 = this_local._4_4_;
    local_13c = 4;
    local_134 = (uint)libtorrent::flags::operator&
                                (this_local._4_4_,
                                 (bitfield_flag<unsigned_int,_libtorrent::save_state_flags_tag,_void>
                                  )4);
    local_211 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_134)
    ;
  }
  if (local_211 != false) {
    this_00 = ::std::
              __shared_ptr_access<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_dht);
    libtorrent::dht::dht_tracker::state(&local_1b0,this_00);
    libtorrent::dht::save_dht_state(&local_168,&local_1b0);
    peVar2 = local_28;
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range2,"dht state");
    peVar2 = entry::operator[](peVar2,___range2);
    entry::operator=(peVar2,&local_168);
    entry::~entry(&local_168);
    libtorrent::dht::dht_state::~dht_state(&local_1b0);
  }
  this_01 = ::std::
            array<std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>,_5UL>
            ::operator[](&this->m_ses_extensions,0);
  __end2 = ::std::
           vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
           ::begin(this_01);
  ext = (shared_ptr<libtorrent::plugin> *)
        ::std::
        vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
        ::end(this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
                                     *)&ext), bVar1) {
    this_02 = (__shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<const_std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
              ::operator*(&__end2);
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_02);
    (*peVar3->_vptr_plugin[0xb])(peVar3,e);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void session_impl::save_state(entry* eptr, save_state_flags_t const flags) const
	{
		TORRENT_ASSERT(is_single_thread());

		entry& e = *eptr;
		// make it a dict
		e.dict();

		if (flags & session::save_settings)
		{
			entry::dictionary_type& sett = e["settings"].dict();
			save_settings_to_dict(non_default_settings(m_settings), sett);
		}

#ifndef TORRENT_DISABLE_DHT
		if (flags & session::save_dht_settings)
		{
			e["dht"] = dht::save_dht_settings(get_dht_settings());
		}

		if (m_dht && (flags & session::save_dht_state))
		{
			e["dht state"] = dht::save_dht_state(m_dht->state());
		}
#endif

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& ext : m_ses_extensions[plugins_all_idx])
		{
			ext->save_state(*eptr);
		}
#endif
	}